

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32lim.h
# Opt level: O0

u32lim_t<1073741824U> operator*(u32lim_t<1073741824U> x,u32lim_t<1073741824U> y)

{
  uint64_t z;
  u32lim_t<1073741824U> y_local;
  u32lim_t<1073741824U> x_local;
  
  if ((ulong)x.value * (ulong)y.value < 0x40000000) {
    u32lim_t<1073741824U>::u32lim_t(&y_local,(ulong)x.value * (ulong)y.value);
  }
  else {
    u32lim_t<1073741824U>::u32lim_t(&y_local,0x40000000);
  }
  return (u32lim_t<1073741824U>)y_local.value;
}

Assistant:

u32lim_t operator * (u32lim_t x, u32lim_t y)
	{
		const uint64_t z
			= static_cast<uint64_t> (x.value)
			* static_cast<uint64_t> (y.value);
		return z < LIMIT
			? u32lim_t (z)
			: u32lim_t (LIMIT);
	}